

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridge.cpp
# Opt level: O2

Belief * __thiscall despot::Bridge::Tau(Bridge *this,Belief *belief,ACT_TYPE action,OBS_TYPE obs)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  long *plVar8;
  ParticleBelief *pPVar9;
  pointer pdVar10;
  int i;
  long lVar11;
  int iVar12;
  int i_1;
  ulong uVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  State *local_60;
  vector<despot::State_*,_std::allocator<despot::State_*>_> new_particles;
  _Vector_base<despot::State_*,_std::allocator<despot::State_*>_> local_40;
  
  if (Tau(despot::Belief_const*,int,unsigned_long)::probs == '\0') {
    iVar7 = __cxa_guard_acquire(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    if (iVar7 != 0) {
      std::vector<double,_std::allocator<double>_>::vector
                (&Tau::probs,(long)BRIDGELENGTH,(allocator_type *)&new_particles);
      __cxa_atexit(std::vector<double,_std::allocator<double>_>::~vector,&Tau::probs,&__dso_handle);
      __cxa_guard_release(&Tau(despot::Belief_const*,int,unsigned_long)::probs);
    }
  }
  plVar8 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  pdVar10 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start;
  iVar5 = LEFT;
  iVar6 = BRIDGELENGTH;
  iVar7 = RIGHT;
  lVar2 = *plVar8;
  lVar3 = plVar8[1];
  dVar16 = 0.0;
  if (obs == 1) {
    dVar14 = 1.0;
  }
  else {
    dVar14 = 0.0;
  }
  iVar1 = BRIDGELENGTH + -1;
  lVar11 = 0;
  do {
    if (lVar3 - lVar2 >> 3 == lVar11) {
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      new_particles.super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      for (uVar13 = 0; (long)uVar13 < (long)iVar6; uVar13 = uVar13 + 1) {
        if (0.0 < pdVar10[uVar13]) {
          local_60 = (State *)(**(code **)(*(long *)this + 0xa8))(0,this,uVar13 & 0xffffffff);
          *(int *)(local_60 + 0x20) = (int)uVar13;
          *(double *)(local_60 + 0x18) =
               Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[uVar13] / dVar16;
          std::vector<despot::State*,std::allocator<despot::State*>>::emplace_back<despot::State*>
                    ((vector<despot::State*,std::allocator<despot::State*>> *)&new_particles,
                     &local_60);
          pdVar10 = Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          Tau::probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[uVar13] = 0.0;
          iVar6 = BRIDGELENGTH;
        }
      }
      pPVar9 = (ParticleBelief *)operator_new(0x90);
      std::vector<despot::State_*,_std::allocator<despot::State_*>_>::vector
                ((vector<despot::State_*,_std::allocator<despot::State_*>_> *)&local_40,
                 &new_particles);
      despot::ParticleBelief::ParticleBelief(pPVar9,&local_40,this,0,0);
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base(&local_40)
      ;
      std::_Vector_base<despot::State_*,_std::allocator<despot::State_*>_>::~_Vector_base
                (&new_particles.
                  super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>);
      return (Belief *)pPVar9;
    }
    lVar4 = *(long *)(lVar2 + lVar11 * 8);
    iVar12 = *(int *)(lVar4 + 0x20);
    if (iVar5 == action) {
      if (iVar12 < 2) {
        iVar12 = 1;
      }
      iVar12 = iVar12 + -1;
LAB_00107a84:
      dVar15 = *(double *)(lVar4 + 0x18) * dVar14;
      dVar16 = dVar16 + dVar15;
      pdVar10[iVar12] = dVar15 + pdVar10[iVar12];
    }
    else {
      if (iVar7 != action) goto LAB_00107a84;
      if (iVar12 < iVar1) {
        iVar12 = iVar12 + 1;
        goto LAB_00107a84;
      }
    }
    lVar11 = lVar11 + 1;
  } while( true );
}

Assistant:

Belief* Bridge::Tau(const Belief* belief, ACT_TYPE action, OBS_TYPE obs) const {
	static vector<double> probs = vector<double>(NumStates());

	const vector<State*>& particles =
		static_cast<const ParticleBelief*>(belief)->particles();

	double sum = 0;
	for (int i = 0; i < particles.size(); i++) {
		BridgeState* state = static_cast<BridgeState*>(particles[i]);
		int next_pos = state->position;
		if (action == LEFT) {
			next_pos--;
			if (next_pos < 0)
				next_pos = 0;
		} else if (action == RIGHT) {
			if (next_pos < BRIDGELENGTH - 1)
				next_pos++;
			else
				continue;
		}

		double p = state->weight * (obs == 1);
		probs[next_pos] += p;
		sum += p;
	}

	vector<State*> new_particles;
	for (int i = 0; i < NumStates(); i++) {
		if (probs[i] > 0) {
			BridgeState* new_particle = static_cast<BridgeState*>(Allocate(i));
			new_particle->position = i;
			new_particle->weight = probs[i] / sum;
			new_particles.push_back(new_particle);
			probs[i] = 0;
		}
	}

	return new ParticleBelief(new_particles, this, NULL, false);
}